

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase54::run(TestCase54 *this)

{
  Builder builder_00;
  Builder builder_01;
  Reader reader_00;
  Reader reader_01;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ReaderOptions options;
  Builder local_290;
  Builder local_268;
  Reader local_240;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  SegmentArrayMessageReader reader;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0,FIXED_SIZE);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_268,&builder.super_MessageBuilder);
  builder_00._builder.capTable = local_268._builder.capTable;
  builder_00._builder.segment = local_268._builder.segment;
  builder_00._builder.data = local_268._builder.data;
  builder_00._builder.pointers = local_268._builder.pointers;
  builder_00._builder.dataSize = local_268._builder.dataSize;
  builder_00._builder.pointerCount = local_268._builder.pointerCount;
  builder_00._builder._38_2_ = local_268._builder._38_2_;
  initTestMessage(builder_00);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_290,&builder.super_MessageBuilder);
  builder_01._builder.capTable = local_290._builder.capTable;
  builder_01._builder.segment = local_290._builder.segment;
  builder_01._builder.data = local_290._builder.data;
  builder_01._builder.pointers = local_290._builder.pointers;
  builder_01._builder.dataSize = local_290._builder.dataSize;
  builder_01._builder.pointerCount = local_290._builder.pointerCount;
  builder_01._builder._38_2_ = local_290._builder._38_2_;
  checkTestMessage(builder_01);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&reader,&builder.super_MessageBuilder);
  StructBuilder::asReader((StructBuilder *)&reader);
  reader_00._reader.capTable = (CapTableReader *)uStack_208;
  reader_00._reader.segment = (SegmentReader *)local_210;
  reader_00._reader.data = (void *)local_200;
  reader_00._reader.pointers = (WirePointer *)uStack_1f8;
  reader_00._reader.dataSize = (undefined4)local_1f0;
  reader_00._reader.pointerCount = local_1f0._4_2_;
  reader_00._reader._38_2_ = local_1f0._6_2_;
  reader_00._reader._40_8_ = uStack_1e8;
  checkTestMessage(reader_00);
  segments = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  SegmentArrayMessageReader::SegmentArrayMessageReader(&reader,segments,options);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_240,&reader.super_MessageReader);
  reader_01._reader.capTable = local_240._reader.capTable;
  reader_01._reader.segment = local_240._reader.segment;
  reader_01._reader.data = local_240._reader.data;
  reader_01._reader.pointers = local_240._reader.pointers;
  reader_01._reader.dataSize = local_240._reader.dataSize;
  reader_01._reader.pointerCount = local_240._reader.pointerCount;
  reader_01._reader._38_2_ = local_240._reader._38_2_;
  reader_01._reader.nestingLimit = local_240._reader.nestingLimit;
  reader_01._reader._44_4_ = local_240._reader._44_4_;
  checkTestMessage(reader_01);
  SegmentArrayMessageReader::~SegmentArrayMessageReader(&reader);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Endian, TwoBytes) {
  byte bytes[] = {0x12, 0x34, 0x56, 0x78};

  WireValue<uint16_t>* vals = reinterpret_cast<WireValue<uint16_t>*>(bytes);

  EXPECT_EQ(0x3412, vals[0].get());
  EXPECT_EQ(0x7856, vals[1].get());

  vals[0].set(0x2345);
  vals[1].set(0x6789);

  EXPECT_EQ(0x45, bytes[0]);
  EXPECT_EQ(0x23, bytes[1]);
  EXPECT_EQ(0x89, bytes[2]);
  EXPECT_EQ(0x67, bytes[3]);
}